

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForJOHI(PlanningUnitMADPDiscrete *this,Index johI)

{
  bool bVar1;
  TreeNode<JointObservationHistory> *this_00;
  JointObservationHistory *this_01;
  size_t sVar2;
  const_reference pvVar3;
  uint in_ESI;
  PlanningUnitMADPDiscrete *in_RDI;
  size_t h;
  Index t;
  Index in_stack_ffffffffffffffd4;
  uint local_18;
  Index local_4;
  
  bVar1 = PlanningUnitMADPDiscreteParameters::GetComputeJointObservationHistories
                    (&in_RDI->_m_params);
  if (bVar1) {
    this_00 = &GetJointObservationHistoryTree(in_RDI,in_stack_ffffffffffffffd4)->
               super_TreeNode<JointObservationHistory>;
    this_01 = TreeNode<JointObservationHistory>::GetContainedElement(this_00);
    sVar2 = History::GetLength((History *)this_01);
    local_4 = (Index)sVar2;
  }
  else {
    local_18 = 0;
    sVar2 = PlanningUnit::GetHorizon(&in_RDI->super_PlanningUnit);
    while( true ) {
      bVar1 = false;
      if (local_18 < sVar2) {
        pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           (&in_RDI->_m_firstJOHIforT,(ulong)local_18);
        bVar1 = *pvVar3 <= (ulong)in_ESI;
      }
      if (!bVar1) break;
      local_18 = local_18 + 1;
    }
    local_18 = local_18 - 1;
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForJOHI(Index johI) const
{
    if(_m_params.GetComputeJointObservationHistories())
        return(GetJointObservationHistoryTree(johI)->GetContainedElement()->
                GetLength() );

    //else... find out what time step this is a joh for
    Index t = 0;
    size_t h=GetHorizon();
    while(  t < h && _m_firstJOHIforT[t] <= johI )
        t++;

    //  _m_firstJOHIforT[t] > johI  OR t==GetHorizon
    if(t == h)
        t--; //last time step is h-1
    else
        t--;//_m_nrJointObservationHistoriesT[t] > johI so johI belongs to 
            //previous time step.
    return(t);
}